

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O0

void __thiscall
Molecules::AddTriple(Molecules *this,KEY_ID s,KEY_ID p,KEY_ID o,KEY_ID prov,unsigned_short scope)

{
  pair<const_unsigned_long,_Molecule> *ppVar1;
  iterator iVar2;
  KEY_ID p_00;
  bool bVar3;
  TYPE_ID TVar4;
  TYPE_ID o_00;
  pointer ppVar5;
  size_type sVar6;
  pointer ppVar7;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  reference pppVar8;
  reference pppVar9;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>,_bool> pVar10;
  pair<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
  local_1a8;
  _Base_ptr local_170;
  undefined1 local_168;
  undefined1 local_160 [8];
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  tt;
  _Self local_128;
  iterator it_inv_molecules_1;
  __normal_iterator<std::pair<const_unsigned_long,_Molecule>_**,_std::vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
  local_118;
  iterator it2_1;
  _Node_iterator_base<unsigned_long,_false> local_108;
  _Node_iterator_base<unsigned_long,_false> local_100;
  _Self local_f8;
  _Self local_f0;
  iterator it2;
  _Self local_e0;
  iterator it;
  size_t t;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *el;
  vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  elems;
  _Self local_a8;
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  *local_a0;
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  *molecules_where_S_exists;
  iterator it_inv_molecules;
  vector<unsigned_long,_std::allocator<unsigned_long>_> molecules_to_search_in;
  undefined1 local_68 [8];
  multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  tripleTmpls;
  unsigned_short scope_local;
  KEY_ID prov_local;
  KEY_ID o_local;
  KEY_ID p_local;
  KEY_ID s_local;
  Molecules *this_local;
  
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ = scope;
  prov_local = o;
  o_local = p;
  p_local = s;
  s_local = (KEY_ID)this;
  std::
  multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::multimap((multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              *)local_68);
  TVar4 = KeyManager::GetType(p_local);
  p_00 = o_local;
  o_00 = KeyManager::GetType(prov_local);
  TemplateManager::GetTemplates
            ((TemplateManager *)diplo::TM,TVar4,p_00,o_00,
             tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_,
             (multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              *)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it_inv_molecules);
  molecules_where_S_exists =
       (set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
        *)std::
          map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
          ::find((map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
                  *)diplo::M,&p_local);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
       ::end((map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
              *)diplo::M);
  bVar3 = std::operator!=((_Self *)&molecules_where_S_exists,&local_a8);
  if (bVar3) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>
                           *)&molecules_where_S_exists);
    local_a0 = &ppVar5->second;
    std::
    vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
    ::vector((vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
              *)&el);
    sVar6 = std::
            multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
            ::size((multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)local_68);
    if (sVar6 != 0) {
      TVar4 = KeyManager::GetType(p_local);
      TypesManager::AddElement((TypesManager *)diplo::TypesM,TVar4,p_local);
      TVar4 = KeyManager::GetType(prov_local);
      TypesManager::AddElement((TypesManager *)diplo::TypesM,TVar4,prov_local);
      it._M_node = (_Base_ptr)0xffffffffffffffff;
      local_e0._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
           ::begin((multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)local_68);
      while( true ) {
        it2._M_node = (_Base_ptr)
                      std::
                      multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      ::end((multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                             *)local_68);
        bVar3 = std::operator!=(&local_e0,(_Self *)&it2);
        iVar2 = it;
        if (!bVar3) break;
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_>::operator->
                           (&local_e0);
        if (iVar2._M_node != (_Base_ptr)(ulong)ppVar7->first) {
          ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_>::operator->
                             (&local_e0);
          it._M_node = (_Base_ptr)(ulong)ppVar7->first;
          this_00 = TypesManager::GetElementsOfType((TypesManager *)diplo::TypesM,ppVar7->first);
          std::
          vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
          ::clear((vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                   *)&el);
          local_f0._M_node =
               (_Base_ptr)
               std::
               set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
               ::begin(local_a0);
          while( true ) {
            local_f8._M_node =
                 (_Base_ptr)
                 std::
                 set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                 ::end(local_a0);
            bVar3 = std::operator!=(&local_f0,&local_f8);
            if (!bVar3) break;
            pppVar8 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                      operator*(&local_f0);
            local_100._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::find(this_00,&(*pppVar8)->first);
            local_108._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::end(this_00);
            bVar3 = std::__detail::operator!=(&local_100,&local_108);
            if (bVar3) {
              pppVar8 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                        operator*(&local_f0);
              std::
              vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
              ::push_back((vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                           *)&el,pppVar8);
            }
            it2_1._M_current =
                 (pair<const_unsigned_long,_Molecule> **)
                 std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Molecule>_*>::
                 operator++(&local_f0,0);
          }
        }
        local_118._M_current =
             (pair<const_unsigned_long,_Molecule> **)
             std::
             vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
             ::begin((vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                      *)&el);
        while( true ) {
          it_inv_molecules_1._M_node =
               (_Base_ptr)
               std::
               vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
               ::end((vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                      *)&el);
          bVar3 = __gnu_cxx::operator!=
                            (&local_118,
                             (__normal_iterator<std::pair<const_unsigned_long,_Molecule>_**,_std::vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
                              *)&it_inv_molecules_1);
          if (!bVar3) break;
          pppVar9 = __gnu_cxx::
                    __normal_iterator<std::pair<const_unsigned_long,_Molecule>_**,_std::vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
                    ::operator*(&local_118);
          ppVar1 = *pppVar9;
          ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_>::operator->
                             (&local_e0);
          Molecule::FindEntityAndAddNext
                    (&ppVar1->second,ppVar7->second,prov_local,p_local,prov,
                     tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_);
          local_128._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
               ::find((map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
                       *)diplo::M,&prov_local);
          tt._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)std::
                       map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
                       ::end((map<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>_>
                              *)diplo::M);
          bVar3 = std::operator==(&local_128,
                                  (_Self *)&tt._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (bVar3) {
            std::
            set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
            ::set((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                   *)local_160);
            pppVar9 = __gnu_cxx::
                      __normal_iterator<std::pair<const_unsigned_long,_Molecule>_**,_std::vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
                      ::operator*(&local_118);
            pVar10 = std::
                     set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                     ::insert((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                               *)local_160,pppVar9);
            local_170 = (_Base_ptr)pVar10.first._M_node;
            local_168 = pVar10.second;
            std::
            pair<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
            ::
            pair<unsigned_long_&,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_&,_true>
                      (&local_1a8,&prov_local,
                       (set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                        *)local_160);
            std::
            map<unsigned_long,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>>
            ::
            insert<std::pair<unsigned_long,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>
                      ((map<unsigned_long,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>>
                        *)this,&local_1a8);
            std::
            pair<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
            ::~pair(&local_1a8);
            std::
            set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
            ::~set((set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                    *)local_160);
          }
          else {
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>_>
                     ::operator->(&local_128);
            pppVar9 = __gnu_cxx::
                      __normal_iterator<std::pair<const_unsigned_long,_Molecule>_**,_std::vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
                      ::operator*(&local_118);
            std::
            set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
            ::insert(&ppVar5->second,pppVar9);
          }
          __gnu_cxx::
          __normal_iterator<std::pair<const_unsigned_long,_Molecule>_**,_std::vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
          ::operator++(&local_118,0);
        }
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_>::operator++
                  (&local_e0,0);
      }
    }
    std::
    vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
    ::~vector((vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
               *)&el);
    elems.
    super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  else {
    elems.
    super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it_inv_molecules);
  std::
  multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~multimap((multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               *)local_68);
  return;
}

Assistant:

void Molecules::AddTriple(KEY_ID s, KEY_ID p, KEY_ID o, KEY_ID prov, unsigned short int scope) {
	multimap<TYPE_ID, size_t> tripleTmpls;
	diplo::TM.GetTemplates(diplo::KM.GetType(s), p, diplo::KM.GetType(o), scope, &tripleTmpls);


	vector<KEY_ID> molecules_to_search_in;

	map <KEY_ID, set< pair<const KEY_ID, Molecule>* > >::iterator it_inv_molecules = diplo::M.inv_molecules.find(s);
	set< pair<const KEY_ID, Molecule>*  > * molecules_where_S_exists;

	if (it_inv_molecules != diplo::M.inv_molecules.end() ) {
		molecules_where_S_exists = &(it_inv_molecules->second);
	} else return; //this subject DOES NOT exist as an object in any triple


	vector< pair<const KEY_ID, Molecule>*  > elems;
	if (tripleTmpls.size() > 0) {

		diplo::TypesM.AddElement(KeyManager::GetType( s ), s );
		diplo::TypesM.AddElement(KeyManager::GetType( o ), o );

		unordered_set< KEY_ID > * el;
		size_t t = -1;

		for (multimap<TYPE_ID, size_t>::iterator it = tripleTmpls.begin(); it !=  tripleTmpls.end(); it ++) { //scan all templates where TRIPLE can exist

			if (t != (size_t)it->first) {
				t = it->first;
				el = diplo::TypesM.GetElementsOfType( t  ); // get list of molecules where triple can be in contexst of the above template
				elems.clear();

				for (set < pair<const KEY_ID, Molecule>* >::iterator it2 = molecules_where_S_exists->begin(); it2 != molecules_where_S_exists->end(); it2++) {
					//check if in the molecule SUBJECT exists as an OBJECT, if YES, that is what we want!!
					if ( el->find( (*it2)->first ) != el->end() ) {
						elems.push_back( *it2 );
					}
				}





			}



			for (vector< pair<const KEY_ID, Molecule>*  >::iterator it2 = elems.begin(); it2 != elems.end(); it2++) {

				(*it2)->second.FindEntityAndAddNext(it->second, o, s, prov, scope); //it has to be added there, molecules are preselected so it is just a question of finding right place to insert the triple
				//so then we can add also to the inverted index, that THE OBJECT (o) in THE MOLECULE pointer by *it2
				map <KEY_ID, set< pair<const KEY_ID, Molecule>* > >::iterator it_inv_molecules = diplo::M.inv_molecules.find(o);

				if (it_inv_molecules == diplo::M.inv_molecules.end() ) {
					set< pair<const KEY_ID, Molecule>* > tt;
					tt.insert( *it2 ) ;
					inv_molecules.insert( pair<KEY_ID, set< pair<const KEY_ID, Molecule>* > > (o, tt ) );
				} else {
					it_inv_molecules->second.insert( *it2 ) ;
				}


			}



		}
	}
}